

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segments_test.cpp
# Opt level: O2

void __thiscall MPSegmentTest_Test1_Test::TestBody(MPSegmentTest_Test1_Test *this)

{
  pointer pbVar1;
  pointer pbVar2;
  string *psVar3;
  char *pcVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *actual;
  AssertHelper local_e0;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8 [4];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  words;
  string s;
  MPSegment segment;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&s,"../dict/jieba.dict.utf8",(allocator<char> *)local_b8);
  pcVar4 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"",(allocator<char> *)&words);
  cppjieba::MPSegment::MPSegment(&segment,&s,(string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&s);
  s._M_dataplus._M_p = (pointer)&s.field_2;
  s._M_string_length = 0;
  s.field_2._M_local_buf[0] = '\0';
  words.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  words.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  words.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,anon_var_dwarf_87cda,(allocator<char> *)local_b8);
  cppjieba::MPSegment::Cut(&segment,(string *)&gtest_ar,&words);
  std::__cxx11::string::~string((string *)&gtest_ar);
  psVar3 = std::operator<<(&s,&words);
  testing::internal::CmpHelperEQ<char[47],std::__cxx11::string>
            ((internal *)&gtest_ar,anon_var_dwarf_87ce5,"s << words",&anon_var_dwarf_87d09,psVar3);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_b8);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hscspring[P]cppjieba/test/unittest/segments_test.cpp"
               ,0x8d,pcVar4);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)local_b8);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gtest_ar,anon_var_dwarf_87722,(allocator<char> *)local_b8);
    cppjieba::MPSegment::Cut(&segment,(string *)&gtest_ar,&words);
    std::__cxx11::string::~string((string *)&gtest_ar);
    psVar3 = std::operator<<(&s,&words);
    testing::internal::CmpHelperEQ<std::__cxx11::string,char[22]>
              ((internal *)&gtest_ar,"s << words",anon_var_dwarf_87d22,psVar3,&anon_var_dwarf_87d3b)
    ;
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)local_b8);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_e0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hscspring[P]cppjieba/test/unittest/segments_test.cpp"
                 ,0x90,pcVar4);
      testing::internal::AssertHelper::operator=(&local_e0,(Message *)local_b8);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&gtest_ar,anon_var_dwarf_87d54,(allocator<char> *)local_b8);
      cppjieba::MPSegment::Cut(&segment,(string *)&gtest_ar,&words);
      std::__cxx11::string::~string((string *)&gtest_ar);
      psVar3 = std::operator<<(&s,&words);
      testing::internal::CmpHelperEQ<char[30],std::__cxx11::string>
                ((internal *)&gtest_ar,anon_var_dwarf_87d5f,"s << words",&anon_var_dwarf_87d6a,
                 psVar3);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)local_b8);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_e0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hscspring[P]cppjieba/test/unittest/segments_test.cpp"
                   ,0x93,pcVar4);
        testing::internal::AssertHelper::operator=(&local_e0,(Message *)local_b8);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&gtest_ar,anon_var_dwarf_87d54,(allocator<char> *)local_b8);
        cppjieba::MPSegment::Cut(&segment,(string *)&gtest_ar,&words,3);
        std::__cxx11::string::~string((string *)&gtest_ar);
        psVar3 = std::operator<<(&s,&words);
        testing::internal::CmpHelperEQ<char[34],std::__cxx11::string>
                  ((internal *)&gtest_ar,anon_var_dwarf_87d75,"s << words",&anon_var_dwarf_87d8e,
                   psVar3);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)local_b8);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar4 = "";
          }
          else {
            pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_e0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/hscspring[P]cppjieba/test/unittest/segments_test.cpp"
                     ,0x97,pcVar4);
          testing::internal::AssertHelper::operator=(&local_e0,(Message *)local_b8);
        }
        else {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar.message_);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&gtest_ar,anon_var_dwarf_87d54,(allocator<char> *)local_b8);
          cppjieba::MPSegment::Cut(&segment,(string *)&gtest_ar,&words,0);
          std::__cxx11::string::~string((string *)&gtest_ar);
          psVar3 = std::operator<<(&s,&words);
          testing::internal::CmpHelperEQ<char[50],std::__cxx11::string>
                    ((internal *)&gtest_ar,anon_var_dwarf_87da7,"s << words",&anon_var_dwarf_87dc0,
                     psVar3);
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)local_b8);
            if (gtest_ar.message_.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar4 = "";
            }
            else {
              pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_e0,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/hscspring[P]cppjieba/test/unittest/segments_test.cpp"
                       ,0x9a,pcVar4);
            testing::internal::AssertHelper::operator=(&local_e0,(Message *)local_b8);
          }
          else {
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr(&gtest_ar.message_);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&gtest_ar,anon_var_dwarf_87dcb,(allocator<char> *)local_b8);
            cppjieba::MPSegment::Cut(&segment,(string *)&gtest_ar,&words);
            std::__cxx11::string::~string((string *)&gtest_ar);
            pbVar2 = words.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            pbVar1 = words.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_b8,"/",(allocator<char> *)&local_e0);
            limonp::
            Join<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                      ((string *)&gtest_ar,(limonp *)pbVar1,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )pbVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_b8,psVar3);
            actual = &s;
            std::__cxx11::string::operator=((string *)actual,(string *)&gtest_ar);
            std::__cxx11::string::~string((string *)&gtest_ar);
            std::__cxx11::string::~string((string *)local_b8);
            testing::internal::CmpHelperEQ<char[26],std::__cxx11::string>
                      ((internal *)&gtest_ar,anon_var_dwarf_87de4,"s",&anon_var_dwarf_87e08,actual);
            if (gtest_ar.success_ != false) {
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr(&gtest_ar.message_);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&gtest_ar,anon_var_dwarf_87dcb,(allocator<char> *)local_b8);
              cppjieba::MPSegment::Cut(&segment,(string *)&gtest_ar,&words,3);
              std::__cxx11::string::~string((string *)&gtest_ar);
              pbVar2 = words.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              pbVar1 = words.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_b8,"/",(allocator<char> *)&local_e0);
              limonp::
              Join<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                        ((string *)&gtest_ar,(limonp *)pbVar1,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          )pbVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_b8,actual);
              std::__cxx11::string::operator=((string *)&s,(string *)&gtest_ar);
              std::__cxx11::string::~string((string *)&gtest_ar);
              std::__cxx11::string::~string((string *)local_b8);
              testing::internal::CmpHelperEQ<char[27],std::__cxx11::string>
                        ((internal *)&gtest_ar,anon_var_dwarf_87e21,"s",&anon_var_dwarf_87e2c,&s);
              if (gtest_ar.success_ == false) {
                testing::Message::Message((Message *)local_b8);
                if (gtest_ar.message_.ptr_ ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar4 = "";
                }
                else {
                  pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_e0,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/hscspring[P]cppjieba/test/unittest/segments_test.cpp"
                           ,0xa2,pcVar4);
                testing::internal::AssertHelper::operator=(&local_e0,(Message *)local_b8);
                testing::internal::AssertHelper::~AssertHelper(&local_e0);
                testing::internal::
                scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr(local_b8);
              }
              goto LAB_00155dbf;
            }
            testing::Message::Message((Message *)local_b8);
            if (gtest_ar.message_.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar4 = "";
            }
            else {
              pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_e0,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/hscspring[P]cppjieba/test/unittest/segments_test.cpp"
                       ,0x9e,pcVar4);
            testing::internal::AssertHelper::operator=(&local_e0,(Message *)local_b8);
          }
        }
      }
    }
  }
  testing::internal::AssertHelper::~AssertHelper(&local_e0);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(local_b8);
LAB_00155dbf:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&words);
  std::__cxx11::string::~string((string *)&s);
  cppjieba::MPSegment::~MPSegment(&segment);
  return;
}

Assistant:

TEST(MPSegmentTest, Test1) {
  MPSegment segment("../dict/jieba.dict.utf8");;
  string s;
  vector<string> words;
  segment.Cut("我来自北京邮电大学。", words);
  ASSERT_EQ("[\"我\", \"来自\", \"北京邮电大学\", \"。\"]", s << words);

  segment.Cut("B超 T恤", words);
  ASSERT_EQ(s << words, "[\"B超\", \" \", \"T恤\"]");

  segment.Cut("南京市长江大桥", words);
  ASSERT_EQ("[\"南京市\", \"长江大桥\"]", s << words);

  // MaxWordLen
  segment.Cut("南京市长江大桥", words, 3);
  ASSERT_EQ("[\"南京市\", \"长江\", \"大桥\"]", s << words);

  segment.Cut("南京市长江大桥", words, 0);
  ASSERT_EQ("[\"南\", \"京\", \"市\", \"长\", \"江\", \"大\", \"桥\"]", s << words);

  segment.Cut("湖南长沙市天心区", words);
  s = Join(words.begin(), words.end(), "/");
  ASSERT_EQ("湖南长沙市/天心区", s);

  segment.Cut("湖南长沙市天心区", words, 3);
  s = Join(words.begin(), words.end(), "/");
  ASSERT_EQ("湖南/长沙市/天心区", s);
}